

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O2

void __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::~BellmanFord(BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *this)

{
  if ((this->_local_pred == true) && (this->_pred != (PredMap *)0x0)) {
    (*(this->_pred->
      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
      ).
      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
      .super_Map.super_ObserverBase._vptr_ObserverBase[1])();
  }
  if ((this->_local_dist == true) && (this->_dist != (DistMap *)0x0)) {
    (*(this->_dist->
      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
      ).
      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
      .super_Map.super_ObserverBase._vptr_ObserverBase[1])();
  }
  if (this->_mask != (MaskMap *)0x0) {
    (*(this->_mask->
      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
      ).
      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      .super_Map.super_ObserverBase._vptr_ObserverBase[1])();
  }
  std::_Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
  ~_Vector_base(&(this->_process).
                 super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               );
  return;
}

Assistant:

~BellmanFord() {
    if (_local_pred)
      delete _pred;
    if (_local_dist)
      delete _dist;
    if (_mask)
      delete _mask;
  }